

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

size_t __thiscall
edition_unittest::TestVerifyBigFieldNumberUint32::ByteSizeLong(TestVerifyBigFieldNumberUint32 *this)

{
  uint32_t *puVar1;
  size_t sVar2;
  size_t sStack_20;
  uint32_t cached_has_bits;
  size_t total_size;
  TestVerifyBigFieldNumberUint32 *this_;
  TestVerifyBigFieldNumberUint32 *this_local;
  
  sStack_20 = 0;
  puVar1 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  if ((*puVar1 & 1) != 0) {
    sStack_20 = google::protobuf::internal::WireFormatLite::
                MessageSize<edition_unittest::TestVerifyBigFieldNumberUint32_Nested>
                          ((this->field_0)._impl_.optional_nested_);
    sStack_20 = sStack_20 + 1;
  }
  sVar2 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_20,&(this->field_0)._impl_._cached_size_);
  return sVar2;
}

Assistant:

::size_t TestVerifyBigFieldNumberUint32::ByteSizeLong() const {
  const TestVerifyBigFieldNumberUint32& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestVerifyBigFieldNumberUint32)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

   {
    // .edition_unittest.TestVerifyBigFieldNumberUint32.Nested optional_nested = 1;
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_nested_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}